

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

bool __thiscall
flatbuffers::SymbolTable<flatbuffers::ServiceDef>::Add
          (SymbolTable<flatbuffers::ServiceDef> *this,string *name,ServiceDef *e)

{
  iterator iVar1;
  bool bVar2;
  mapped_type *ppSVar3;
  _Self local_38;
  _Self local_30;
  iterator it;
  ServiceDef *e_local;
  string *name_local;
  SymbolTable<flatbuffers::ServiceDef> *this_local;
  
  it._M_node = (_Base_ptr)e;
  std::vector<flatbuffers::ServiceDef*,std::allocator<flatbuffers::ServiceDef*>>::
  emplace_back<flatbuffers::ServiceDef*&>
            ((vector<flatbuffers::ServiceDef*,std::allocator<flatbuffers::ServiceDef*>> *)&this->vec
             ,(ServiceDef **)&it);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::ServiceDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::ServiceDef_*>_>_>
       ::find(&this->dict,name);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::ServiceDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::ServiceDef_*>_>_>
       ::end(&this->dict);
  bVar2 = std::operator!=(&local_30,&local_38);
  iVar1 = it;
  if (!bVar2) {
    ppSVar3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::ServiceDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::ServiceDef_*>_>_>
              ::operator[](&this->dict,name);
    *ppSVar3 = (mapped_type)iVar1._M_node;
  }
  return bVar2;
}

Assistant:

bool Add(const std::string &name, T *e) {
    vec.emplace_back(e);
    auto it = dict.find(name);
    if (it != dict.end()) return true;
    dict[name] = e;
    return false;
  }